

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint16 value)

{
  deUint8 data [2];
  
  data = (deUint8  [2])(value ^ 0x91cb);
  SeedBuilder::feed(builder,2,data);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint16 value)
{
	const deUint16	val		= value ^ 37323u;
	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)(val >> 8),
	};

	builder.feed(sizeof(data), data);
	return builder;
}